

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O3

void __thiscall QStackedLayout::heightForWidth(QStackedLayout *this)

{
  int in_ESI;
  
  heightForWidth((QStackedLayout *)&this[-1].super_QLayout.super_QLayoutItem,in_ESI);
  return;
}

Assistant:

int QStackedLayout::heightForWidth(int width) const
{
    const int n = count();

    int hfw = 0;
    for (int i = 0; i < n; ++i) {
        if (QLayoutItem *item = itemAt(i)) {
            if (QWidget *w = item->widget())
                /*
                Note: Does not query the layout item, but bypasses it and asks the widget
                directly. This is consistent with how QStackedLayout::sizeHint() is
                implemented. This also avoids an issue where QWidgetItem::heightForWidth()
                returns -1 if the widget is hidden.
                */
                hfw = qMax(hfw, w->heightForWidth(width));
        }
    }
    hfw = qMax(hfw, minimumSize().height());
    return hfw;
}